

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_extended_msg(raft_server *this,req_msg *req)

{
  msg_type mVar1;
  strfmt<100> *this_00;
  element_type *peVar2;
  char *__s;
  raft_server *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  req_msg *in_RSI;
  raft_server *in_RDI;
  ptr<resp_msg> pVar4;
  req_msg *unaff_retaddr;
  raft_server *in_stack_00000008;
  req_msg *in_stack_00000190;
  raft_server *in_stack_00000198;
  req_msg *in_stack_000001d0;
  raft_server *in_stack_000001d8;
  req_msg *in_stack_00000200;
  raft_server *in_stack_00000208;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  req_msg *in_stack_ffffffffffffff50;
  raft_server *in_stack_ffffffffffffff58;
  string local_38 [24];
  req_msg *in_stack_ffffffffffffffe0;
  req_msg *req_00;
  raft_server *this_01;
  
  req_00 = in_RSI;
  this_01 = in_RDI;
  mVar1 = msg_base::get_type((msg_base *)in_RDX);
  __s = (char *)(ulong)(mVar1 - add_server_request);
  switch(__s) {
  case (char *)0x0:
    pVar4 = handle_add_srv_req(in_stack_000001d8,in_stack_000001d0);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  default:
    this_00 = (strfmt<100> *)
              std::
              __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d6623);
    strfmt<100>::strfmt((strfmt<100> *)&stack0xffffffffffffff58,
                        "receive an unknown request %s, for safety, step down.");
    msg_base::get_type((msg_base *)in_RDX);
    strfmt<100>::fmt<char_const*>(this_00,in_stack_fffffffffffffef8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,__s,(allocator<char> *)in_RSI);
    (**(code **)(*(long *)this_00->buf_ + 0x28))(this_00,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1d66ce);
    peVar2 = std::
             __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d66d6);
    (*peVar2->_vptr_state_mgr[8])(peVar2,0xffffffff);
    exit(-1);
  case (char *)0x2:
    pVar4 = handle_rm_srv_req(in_stack_00000198,in_stack_00000190);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case (char *)0x4:
    pVar4 = handle_log_sync_req(this_01,req_00);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case (char *)0x6:
    pVar4 = handle_join_cluster_req(in_stack_00000008,unaff_retaddr);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case (char *)0x8:
    pVar4 = handle_leave_cluster_req(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case (char *)0xa:
    pVar4 = handle_install_snapshot_req(in_stack_00000208,in_stack_00000200);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case (char *)0xc:
    pVar4 = handle_prevote_req(in_RDX,in_stack_ffffffffffffffe0);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<resp_msg>)pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_extended_msg(req_msg& req)
{
    switch (req.get_type())
    {
        case msg_type::add_server_request:
            return handle_add_srv_req(req);
        case msg_type::remove_server_request:
            return handle_rm_srv_req(req);
        case msg_type::sync_log_request:
            return handle_log_sync_req(req);
        case msg_type::join_cluster_request:
            return handle_join_cluster_req(req);
        case msg_type::leave_cluster_request:
            return handle_leave_cluster_req(req);
        case msg_type::install_snapshot_request:
            return handle_install_snapshot_req(req);
        case msg_type::prevote_request:
            return handle_prevote_req(req);
        default:
            l_->err(
                sstrfmt("receive an unknown request %s, for safety, step down.").fmt(__msg_type_str[req.get_type()]));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            break;
    }

    return ptr<resp_msg>();
}